

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.h
# Opt level: O3

void __thiscall CVmObjTable::alloc_check_gc(CVmObjTable *this,int do_count)

{
  if (do_count != 0) {
    this->allocs_since_gc_ = this->allocs_since_gc_ + 1;
  }
  if (((this->field_0x78 & 1) != 0) &&
     ((this->max_allocs_between_gc_ < this->allocs_since_gc_ ||
      (this->max_bytes_between_gc_ < this->bytes_since_gc_)))) {
    gc_pass_init(this);
    gc_pass_finish(this);
    return;
  }
  return;
}

Assistant:

void alloc_check_gc(VMG_ int do_count)
    {
        /* count the allocation if desired */
        if (do_count)
            ++allocs_since_gc_;

        /* if we've passed our threshhold for collecting garbage, do so now */
        if (gc_enabled_
            && (allocs_since_gc_ > max_allocs_between_gc_
                || bytes_since_gc_ > max_bytes_between_gc_))
            gc_before_alloc(vmg0_);
    }